

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall tinyusdz::ListOp<unsigned_int>::~ListOp(ListOp<unsigned_int> *this)

{
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->ordered_items).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->deleted_items).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
  ;
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->appended_items).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->prepended_items).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->added_items).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->explicit_items).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            );
  return;
}

Assistant:

ListOp() : is_explicit(false) {}